

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::cmGeneratorTarget(cmGeneratorTarget *this,cmTarget *t,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  cmGlobalGenerator *pcVar2;
  cmTarget *pcVar3;
  _WordT _Var4;
  _WordT _Var5;
  _WordT _Var6;
  _WordT _Var7;
  _WordT _Var8;
  cmMakefile *pcVar9;
  PolicyMap *pPVar10;
  cmValue cVar11;
  cmBTStringRange cVar12;
  allocator<char> local_1a9;
  string *local_1a8;
  TargetPropertyEntryVector *local_1a0;
  TargetPropertyEntryVector *local_198;
  TargetPropertyEntryVector *local_190;
  TargetPropertyEntryVector *local_188;
  TargetPropertyEntryVector *local_180;
  TargetPropertyEntryVector *local_178;
  TargetPropertyEntryVector *local_170;
  TargetPropertyEntryVector *local_168;
  string local_50;
  
  this->Target = t;
  (this->ObjectDirectory)._M_dataplus._M_p = (pointer)&(this->ObjectDirectory).field_2;
  (this->ObjectDirectory)._M_string_length = 0;
  (this->ObjectDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->FortranModuleDirectoryCreated = false;
  (this->FortranModuleDirectory)._M_dataplus._M_p = (pointer)&(this->FortranModuleDirectory).field_2
  ;
  (this->FortranModuleDirectory)._M_string_length = 0;
  (this->FortranModuleDirectory).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->SourceDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->VisitedConfigsForObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->Objects)._M_t._M_impl.super__Rb_tree_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_buckets =
       &(this->MacOSXRpathInstallNameDirCache)._M_h._M_single_bucket;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_bucket_count = 1;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_element_count = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->MacOSXRpathInstallNameDirCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SystemIncludesCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ExportMacro)._M_dataplus._M_p = (pointer)&(this->ExportMacro).field_2;
  (this->ExportMacro)._M_string_length = 0;
  (this->ExportMacro).field_2._M_local_buf[0] = '\0';
  this->SourceFileFlagsConstructed = false;
  p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->LinkerLanguage)._M_dataplus._M_p = (pointer)&(this->LinkerLanguage).field_2;
  (this->LinkerLanguage)._M_string_length = 0;
  (this->LinkerLanguage).field_2._M_local_buf[0] = '\0';
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8 = (string *)&this->LinkerLanguage;
  p_Var1 = &(this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->DeviceLink = false;
  p_Var1 = &(this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CompatibleInterfacesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInformation)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->LinkInformation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplClosureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkInterfaceMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->LinkInterfaceUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0
  ;
  p_Var1 = &(this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ImportInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->KindedSourcesMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->AllConfigSources).
  super__Vector_base<cmGeneratorTarget::AllConfigSource,_std::allocator<cmGeneratorTarget::AllConfigSource>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MaybeInterfacePropertyExists)._M_h._M_buckets =
       &(this->MaybeInterfacePropertyExists)._M_h._M_single_bucket;
  (this->MaybeInterfacePropertyExists)._M_h._M_bucket_count = 1;
  (this->MaybeInterfacePropertyExists)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MaybeInterfacePropertyExists)._M_h._M_element_count = 0;
  (this->MaybeInterfacePropertyExists)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_168 = &this->IncludeDirectoriesEntries;
  local_170 = &this->CompileOptionsEntries;
  local_178 = &this->CompileFeaturesEntries;
  local_180 = &this->CompileDefinitionsEntries;
  local_188 = &this->LinkOptionsEntries;
  local_190 = &this->LinkDirectoriesEntries;
  local_198 = &this->PrecompileHeadersEntries;
  local_1a0 = &this->SourceEntries;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header;
  memset(&(this->MaybeInterfacePropertyExists)._M_h._M_rehash_policy._M_next_resize,0,0xd0);
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchHeaders)._M_t._M_impl.super__Rb_tree_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchHeaders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchSources)._M_t._M_impl.super__Rb_tree_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchSources)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->PchFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PchCreateCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->PchUseCompileOptions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_buckets =
       &(this->UnityBatchedSourceFiles)._M_h._M_single_bucket;
  (this->UnityBatchedSourceFiles)._M_h._M_bucket_count = 1;
  (this->UnityBatchedSourceFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->UnityBatchedSourceFiles)._M_h._M_element_count = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->UnityBatchedSourceFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->UnityBatchedSourceFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCGeneratedHeaders)._M_h._M_buckets = &(this->ISPCGeneratedHeaders)._M_h._M_single_bucket
  ;
  (this->ISPCGeneratedHeaders)._M_h._M_bucket_count = 1;
  (this->ISPCGeneratedHeaders)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCGeneratedHeaders)._M_h._M_element_count = 0;
  (this->ISPCGeneratedHeaders)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ISPCGeneratedHeaders)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCGeneratedHeaders)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCGeneratedObjects)._M_h._M_buckets = &(this->ISPCGeneratedObjects)._M_h._M_single_bucket
  ;
  (this->ISPCGeneratedObjects)._M_h._M_bucket_count = 1;
  (this->ISPCGeneratedObjects)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCGeneratedObjects)._M_h._M_element_count = 0;
  (this->ISPCGeneratedObjects)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ISPCGeneratedObjects)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCGeneratedObjects)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LinkImplMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LinkImplUsageRequirementsOnlyMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ModuleDefinitionInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->UtilityItems)._M_t._M_impl.super__Rb_tree_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)(this->PolicyMap).Status.super__Base_bitset<7UL>._M_w + 0x33) = 0;
  this->DebugCompileOptionsDone = false;
  this->DebugCompileFeaturesDone = false;
  this->DebugCompileDefinitionsDone = false;
  this->DebugLinkOptionsDone = false;
  this->DebugLinkDirectoriesDone = false;
  this->DebugPrecompileHeadersDone = false;
  this->DebugSourcesDone = false;
  this->UtilityItemsDone = false;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[5] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[3] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[4] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[1] = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[2] = 0;
  (this->UtilityItems)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[0] = 0;
  this->SourcesAreContextDependent = Indeterminate;
  p_Var1 = &(this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageStandardMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandards)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar9 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar9;
  this->LocalGenerator = lg;
  pcVar2 = lg->GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  (*pcVar2->_vptr_cmGlobalGenerator[0x37])(pcVar2,this);
  cVar12 = cmTarget::GetIncludeDirectoriesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_168,false);
  cVar12 = cmTarget::GetCompileOptionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_170,false);
  cVar12 = cmTarget::GetCompileFeaturesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_178,false);
  cVar12 = cmTarget::GetCompileDefinitionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_180,false);
  cVar12 = cmTarget::GetLinkOptionsEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_188,false);
  cVar12 = cmTarget::GetLinkDirectoriesEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_190,false);
  cVar12 = cmTarget::GetPrecompileHeadersEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_198,false);
  cVar12 = cmTarget::GetSourceEntries_abi_cxx11_(t);
  CreatePropertyGeneratorExpressions(cVar12,local_1a0,true);
  pPVar10 = cmTarget::GetPolicyMap(t);
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[6] =
       (pPVar10->Status).super__Base_bitset<7UL>._M_w[6];
  _Var4 = (pPVar10->Status).super__Base_bitset<7UL>._M_w[0];
  _Var5 = (pPVar10->Status).super__Base_bitset<7UL>._M_w[1];
  _Var6 = (pPVar10->Status).super__Base_bitset<7UL>._M_w[2];
  _Var7 = (pPVar10->Status).super__Base_bitset<7UL>._M_w[3];
  _Var8 = (pPVar10->Status).super__Base_bitset<7UL>._M_w[5];
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[4] =
       (pPVar10->Status).super__Base_bitset<7UL>._M_w[4];
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[5] = _Var8;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[2] = _Var6;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[3] = _Var7;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[0] = _Var4;
  (this->PolicyMap).Status.super__Base_bitset<7UL>._M_w[1] = _Var5;
  pcVar3 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"HAS_CXX",&local_1a9);
  cVar11 = cmTarget::GetProperty(pcVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (cVar11.Value == (string *)0x0) {
    pcVar3 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"LINKER_LANGUAGE",&local_1a9);
    cmTarget::GetSafeProperty(pcVar3,&local_50);
    std::__cxx11::string::_M_assign(local_1a8);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    std::__cxx11::string::assign((char *)local_1a8);
  }
  return;
}

Assistant:

cmGeneratorTarget::cmGeneratorTarget(cmTarget* t, cmLocalGenerator* lg)
  : Target(t)
{
  this->Makefile = this->Target->GetMakefile();
  this->LocalGenerator = lg;
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();

  this->GlobalGenerator->ComputeTargetObjectDirectory(this);

  CreatePropertyGeneratorExpressions(t->GetIncludeDirectoriesEntries(),
                                     this->IncludeDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileOptionsEntries(),
                                     this->CompileOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileFeaturesEntries(),
                                     this->CompileFeaturesEntries);

  CreatePropertyGeneratorExpressions(t->GetCompileDefinitionsEntries(),
                                     this->CompileDefinitionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkOptionsEntries(),
                                     this->LinkOptionsEntries);

  CreatePropertyGeneratorExpressions(t->GetLinkDirectoriesEntries(),
                                     this->LinkDirectoriesEntries);

  CreatePropertyGeneratorExpressions(t->GetPrecompileHeadersEntries(),
                                     this->PrecompileHeadersEntries);

  CreatePropertyGeneratorExpressions(t->GetSourceEntries(),
                                     this->SourceEntries, true);

  this->PolicyMap = t->GetPolicyMap();

  // Get hard-coded linker language
  if (this->Target->GetProperty("HAS_CXX")) {
    this->LinkerLanguage = "CXX";
  } else {
    this->LinkerLanguage = this->Target->GetSafeProperty("LINKER_LANGUAGE");
  }
}